

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs
          (BuildSystemFrontendDelegate *this,Command *command,Node *output,
          ArrayRef<llbuild::buildsystem::BuildKey> inputs)

{
  pointer pcVar1;
  Kind KVar2;
  raw_ostream *prVar3;
  char *pcVar4;
  BuildKey *this_00;
  BuildKey *__n;
  size_type sVar5;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef SVar6;
  undefined1 *local_a8;
  void *local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  size_type local_88;
  string message;
  raw_string_ostream messageStream;
  
  local_88 = inputs.Length;
  this_00 = inputs.Data;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  messageStream.super_raw_ostream.BufferMode = InternalBuffer;
  messageStream.super_raw_ostream.OutBufStart = (char *)0x0;
  messageStream.super_raw_ostream.OutBufEnd = (char *)0x0;
  messageStream.super_raw_ostream.OutBufCur = (char *)0x0;
  messageStream.super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__raw_string_ostream_00238d10;
  messageStream.OS = &message;
  SVar6.Length = 0xe;
  SVar6.Data = "cannot build \'";
  __n = this_00;
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,SVar6);
  pcVar1 = (output->name)._M_dataplus._M_p;
  if (pcVar1 == (pointer)0x0) {
    local_a8 = &local_98;
    local_a0 = (void *)0x0;
    local_98 = 0;
  }
  else {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,pcVar1,pcVar1 + (output->name)._M_string_length);
  }
  llvm::raw_ostream::write(&messageStream.super_raw_ostream,(int)local_a8,local_a0,(size_t)__n);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  Str.Length = 0x19;
  Str.Data = "\' due to missing inputs: ";
  llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str);
  if (local_88 != 0) {
    sVar5 = 0;
    do {
      if (sVar5 != 0) {
        Str_00.Length = 2;
        Str_00.Data = ", ";
        llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str_00);
      }
      Str_01.Length = 1;
      Str_01.Data = "\'";
      prVar3 = llvm::raw_ostream::operator<<(&messageStream.super_raw_ostream,Str_01);
      KVar2 = BuildKey::kindForIdentifier(*(this_00->key).key._M_dataplus._M_p);
      if (KVar2 == Node) {
        SVar6 = BuildKey::getNodeName(this_00);
        pcVar4 = SVar6.Data;
        local_a8 = &local_98;
        if (pcVar4 == (char *)0x0) {
          local_a0 = (void *)0x0;
          local_98 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,pcVar4,pcVar4 + SVar6.Length);
        }
      }
      else {
        local_a8 = &local_98;
        pcVar1 = (this_00->key).key._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar1,pcVar1 + (this_00->key).key._M_string_length);
      }
      prVar3 = (raw_ostream *)llvm::raw_ostream::write(prVar3,(int)local_a8,local_a0,(size_t)__n);
      Str_02.Length = 1;
      Str_02.Data = "\'";
      llvm::raw_ostream::operator<<(prVar3,Str_02);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      sVar5 = sVar5 + 1;
      this_00 = this_00 + 1;
    } while (local_88 != sVar5);
  }
  if (messageStream.super_raw_ostream.OutBufCur != messageStream.super_raw_ostream.OutBufStart) {
    llvm::raw_ostream::flush_nonempty(&messageStream.super_raw_ostream);
  }
  fwrite(message._M_dataplus._M_p,message._M_string_length,1,_stderr);
  fflush(_stderr);
  llvm::raw_string_ostream::~raw_string_ostream(&messageStream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message._M_dataplus._M_p != &message.field_2) {
    operator_delete(message._M_dataplus._M_p,
                    CONCAT71(message.field_2._M_allocated_capacity._1_7_,
                             message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs(
     Command * command, Node *output, ArrayRef<BuildKey> inputs) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "cannot build '";
  messageStream << output->getName().str();
  messageStream << "' due to missing inputs: ";

  for (size_t i = 0; i < inputs.size(); ++i) {
    if (i > 0) {
      messageStream << ", ";
    }
    messageStream << "'" << (inputs[i].isNode() ? inputs[i].getNodeName().str() : inputs[i].getKeyData().str()) << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}